

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::edit_distance::CreateUnifiedDiff
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *left,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *right,size_t context)

{
  uint uVar1;
  _List_node_base *p_Var2;
  char *__s;
  undefined8 *puVar3;
  long *plVar4;
  bool bVar5;
  bool bVar6;
  undefined8 *puVar7;
  string *psVar8;
  _List_node_base *p_Var9;
  ostream *poVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  size_t i;
  size_t sVar14;
  char edit;
  ulong uVar15;
  pointer pEVar16;
  pointer pEVar17;
  long *plVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  stringstream local_278 [8];
  stringstream ss;
  ostream local_268 [112];
  ios_base local_1f8 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_f0;
  string *local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e0;
  undefined1 local_d8 [8];
  Hunk hunk;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  edits;
  char local_31;
  
  local_f0 = right;
  local_e8 = __return_storage_ptr__;
  CalculateOptimalEdits
            ((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
              *)&hunk.hunk_removes_.
                 super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                 ._M_impl._M_node._M_size,left,right);
  std::__cxx11::stringstream::stringstream(local_278);
  uVar20 = 0;
  uVar23 = 0;
  edits.
  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = left;
  do {
    uVar12 = (long)((long)edits.
                          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                   hunk.hunk_removes_.
                   super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                   ._M_impl._M_node._M_size) >> 2;
    if (uVar12 <= uVar23) break;
    uVar15 = (uVar12 + uVar20) - uVar23;
    pEVar16 = (pointer)((long)edits.
                              super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + (uVar12 - uVar23)
                       );
    uVar19 = uVar20;
    uVar22 = uVar23;
    do {
      pEVar17 = edits.
                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      uVar20 = uVar19;
      uVar23 = uVar22;
      if (*(int *)(hunk.hunk_removes_.
                   super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                   ._M_impl._M_node._M_size + uVar22 * 4) != 0) break;
      uVar19 = uVar19 + 1;
      edits.
      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)edits.
                           super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      uVar22 = uVar22 + 1;
      pEVar17 = pEVar16;
      uVar20 = uVar15;
      uVar23 = uVar12;
    } while (uVar12 != uVar22);
    sVar14 = context;
    if (uVar20 < context) {
      sVar14 = uVar20;
    }
    local_d8 = (undefined1  [8])((uVar20 - sVar14) + 1);
    hunk.left_start_ = (long)pEVar17 + (1 - sVar14);
    hunk.removes_ = 0;
    hunk.right_start_ = 0;
    hunk.adds_ = 0;
    hunk.common_ = (size_t)&hunk.common_;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size =
         (size_t)&hunk.hunk_.
                  super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                  ._M_impl._M_node._M_size;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size =
         (size_t)&hunk.hunk_adds_.
                  super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                  ._M_impl._M_node._M_size;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    hunk.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)hunk.common_;
    hunk.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)
         hunk.hunk_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node._M_size;
    hunk.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)
         hunk.hunk_adds_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node._M_size;
    if (sVar14 != 0) {
      lVar21 = uVar20 * 0x20 + sVar14 * -0x20;
      do {
        anon_unknown_1::Hunk::PushLine
                  ((Hunk *)local_d8,' ',
                   *(char **)((long)&(((left->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar21));
        lVar21 = lVar21 + 0x20;
        sVar14 = sVar14 - 1;
      } while (sVar14 != 0);
      uVar12 = (long)((long)edits.
                            super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                            ._M_impl.super__Vector_impl_data._M_start -
                     hunk.hunk_removes_.
                     super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                     ._M_impl._M_node._M_size) >> 2;
    }
    edits.
    super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar17;
    if (uVar23 < uVar12) {
      lVar21 = uVar23 * 4;
      uVar12 = 0;
      do {
        lVar21 = (lVar21 << 0x1e) >> 0x1e;
        if (context <= uVar12) {
          pEVar16 = (pointer)(hunk.hunk_removes_.
                              super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                              ._M_impl._M_node._M_size + (long)(int)uVar23 * 4);
          lVar13 = lVar21;
          while( true ) {
            if (pEVar16 ==
                edits.
                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                ._M_impl.super__Vector_impl_data._M_start) goto LAB_00111348;
            if (*pEVar16 != kMatch) break;
            pEVar16 = pEVar16 + 1;
            lVar13 = lVar13 + 4;
          }
          if ((pEVar16 ==
               edits.
               super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
               ._M_impl.super__Vector_impl_data._M_start) || (context <= (lVar13 >> 2) - uVar23))
          break;
        }
        uVar1 = *(uint *)(hunk.hunk_removes_.
                          super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                          ._M_impl._M_node._M_size + uVar23 * 4);
        uVar12 = uVar12 + 1;
        if (uVar1 != 0) {
          uVar12 = 0;
        }
        if ((uVar1 < 4) && (uVar1 != 1)) {
          edit = '-';
          if (uVar1 == 0) {
            edit = ' ';
          }
          anon_unknown_1::Hunk::PushLine
                    ((Hunk *)local_d8,edit,
                     (local_e0->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar20]._M_dataplus._M_p);
        }
        if ((uVar1 & 0xfffffffd) == 1) {
          p_Var2 = (_List_node_base *)
                   (local_f0->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start
                   [(long)edits.
                          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage]._M_dataplus._M_p;
          hunk.right_start_ = hunk.right_start_ + 1;
          p_Var9 = (_List_node_base *)operator_new(0x20);
          *(undefined1 *)&p_Var9[1]._M_next = 0x2b;
          p_Var9[1]._M_prev = p_Var2;
          std::__detail::_List_node_base::_M_hook(p_Var9);
          hunk.hunk_adds_.
          super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev =
               (_List_node_base *)
               ((long)&(hunk.hunk_adds_.
                        super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                        ._M_impl._M_node.super__List_node_base._M_prev)->_M_next + 1);
        }
        uVar20 = uVar20 + (uVar1 != 1);
        edits.
        super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)edits.
                             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage +
                      (ulong)(uVar1 != 2));
        uVar23 = uVar23 + 1;
        lVar21 = lVar21 + 4;
      } while (uVar23 < (ulong)((long)((long)edits.
                                             super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                             ._M_impl.super__Vector_impl_data._M_start -
                                      hunk.hunk_removes_.
                                      super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                                      ._M_impl._M_node._M_size) >> 2));
    }
LAB_00111348:
    bVar5 = hunk.adds_ != 0;
    bVar6 = hunk.right_start_ != 0;
    if (bVar5 || bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>(local_268,"@@ ",3);
      if (hunk.adds_ != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_268,"-",1);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_268);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        if (hunk.right_start_ != 0 && hunk.adds_ != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_268," ",1);
        }
      }
      if (hunk.right_start_ != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_268,"+",1);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_268);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_268," @@\n",4);
      anon_unknown_1::Hunk::FlushEdits((Hunk *)local_d8);
      plVar18 = (long *)hunk.common_;
      if ((size_t *)hunk.common_ != &hunk.common_) {
        do {
          local_31 = (char)plVar18[2];
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>(local_268,&local_31,1);
          __s = (char *)plVar18[3];
          if (__s == (char *)0x0) {
            std::ios::clear((int)poVar10 + (int)*(undefined8 *)(*(long *)poVar10 + -0x18));
          }
          else {
            sVar11 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,__s,sVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          plVar18 = (long *)*plVar18;
        } while ((size_t *)plVar18 != &hunk.common_);
      }
    }
    left = local_e0;
    puVar7 = (undefined8 *)
             hunk.hunk_adds_.
             super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
             ._M_impl._M_node._M_size;
    while (local_e0 = left,
          puVar7 != &hunk.hunk_adds_.
                     super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                     ._M_impl._M_node._M_size) {
      puVar3 = (undefined8 *)*puVar7;
      operator_delete(puVar7,0x20);
      left = local_e0;
      puVar7 = puVar3;
    }
    puVar7 = (undefined8 *)
             hunk.hunk_.
             super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
             ._M_impl._M_node._M_size;
    while (puVar7 != &hunk.hunk_.
                      super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                      ._M_impl._M_node._M_size) {
      puVar3 = (undefined8 *)*puVar7;
      operator_delete(puVar7,0x20);
      puVar7 = puVar3;
    }
    plVar18 = (long *)hunk.common_;
    if ((size_t *)hunk.common_ != &hunk.common_) {
      do {
        plVar4 = (long *)*plVar18;
        operator_delete(plVar18,0x20);
        plVar18 = plVar4;
      } while ((size_t *)plVar4 != &hunk.common_);
    }
  } while (bVar5 || bVar6);
  psVar8 = local_e8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_278);
  std::ios_base::~ios_base(local_1f8);
  if (hunk.hunk_removes_.
      super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
      ._M_impl._M_node._M_size != 0) {
    operator_delete((void *)hunk.hunk_removes_.
                            super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                            ._M_impl._M_node._M_size,
                    (long)edits.
                          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    hunk.hunk_removes_.
                    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                    ._M_impl._M_node._M_size);
  }
  return psVar8;
}

Assistant:

std::string CreateUnifiedDiff(const std::vector<std::string>& left,
                              const std::vector<std::string>& right,
                              size_t context) {
  const std::vector<EditType> edits = CalculateOptimalEdits(left, right);

  size_t l_i = 0, r_i = 0, edit_i = 0;
  std::stringstream ss;
  while (edit_i < edits.size()) {
    // Find first edit.
    while (edit_i < edits.size() && edits[edit_i] == kMatch) {
      ++l_i;
      ++r_i;
      ++edit_i;
    }

    // Find the first line to include in the hunk.
    const size_t prefix_context = std::min(l_i, context);
    Hunk hunk(l_i - prefix_context + 1, r_i - prefix_context + 1);
    for (size_t i = prefix_context; i > 0; --i) {
      hunk.PushLine(' ', left[l_i - i].c_str());
    }

    // Iterate the edits until we found enough suffix for the hunk or the input
    // is over.
    size_t n_suffix = 0;
    for (; edit_i < edits.size(); ++edit_i) {
      if (n_suffix >= context) {
        // Continue only if the next hunk is very close.
        auto it = edits.begin() + static_cast<int>(edit_i);
        while (it != edits.end() && *it == kMatch) ++it;
        if (it == edits.end() ||
            static_cast<size_t>(it - edits.begin()) - edit_i >= context) {
          // There is no next edit or it is too far away.
          break;
        }
      }

      EditType edit = edits[edit_i];
      // Reset count when a non match is found.
      n_suffix = edit == kMatch ? n_suffix + 1 : 0;

      if (edit == kMatch || edit == kRemove || edit == kReplace) {
        hunk.PushLine(edit == kMatch ? ' ' : '-', left[l_i].c_str());
      }
      if (edit == kAdd || edit == kReplace) {
        hunk.PushLine('+', right[r_i].c_str());
      }

      // Advance indices, depending on edit type.
      l_i += edit != kAdd;
      r_i += edit != kRemove;
    }

    if (!hunk.has_edits()) {
      // We are done. We don't want this hunk.
      break;
    }

    hunk.PrintTo(&ss);
  }
  return ss.str();
}